

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O2

void ParseGen(SFFile *sf2,FileReader *f,DWORD chunkid,DWORD chunklen)

{
  int iVar1;
  SFGenList *pSVar2;
  undefined8 uVar3;
  uint uVar4;
  long lVar5;
  
  if ((chunklen & 3) == 0) {
    uVar4 = chunklen >> 2;
    if (chunkid == 0x6e656769) {
      if (uVar4 != sf2->InstrBags[(long)sf2->NumInstrBags + -1].GenIndex + 1) goto LAB_00347ae4;
      pSVar2 = (SFGenList *)operator_new__((ulong)chunklen);
      sf2->InstrGenerators = pSVar2;
      sf2->NumInstrGenerators = uVar4;
    }
    else {
      if (chunkid != 0x6e656770) {
        __assert_fail("chunkid == ID_igen",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/timidity/instrum_sf2.cpp"
                      ,0x241,"void ParseGen(SFFile *, FileReader *, DWORD, DWORD)");
      }
      if (uVar4 != sf2->PresetBags[(long)sf2->NumPresetBags + -1].GenIndex + 1) goto LAB_00347ae4;
      pSVar2 = (SFGenList *)operator_new__((ulong)chunklen);
      sf2->PresetGenerators = pSVar2;
      sf2->NumPresetGenerators = uVar4;
    }
    for (lVar5 = 0; uVar4 != (uint)lVar5; lVar5 = lVar5 + 1) {
      iVar1 = read_uword(f);
      pSVar2[lVar5].Oper = (SFGenerator)iVar1;
      iVar1 = read_uword(f);
      pSVar2[lVar5].field_1.Amount = (SWORD)iVar1;
    }
    return;
  }
LAB_00347ae4:
  uVar3 = __cxa_allocate_exception(1);
  __cxa_throw(uVar3,&CBadForm::typeinfo,0);
}

Assistant:

static void ParseGen(SFFile *sf2, FileReader *f, DWORD chunkid, DWORD chunklen)
{
	SFGenList *gens, *gen;
	int numgens;
	int i;

	// Section 7.5, page 24:
	//		If the PGEN sub-chunk is missing, or its size is not a multiple of
	//		four bytes, the file should be rejected as structurally unsound.
	if (chunklen & 3)
	{
		throw CBadForm();
	}
	numgens = chunklen >> 2;

	if (chunkid == ID_pgen)
	{
		// Section 7.3, page 22:
		//		the size of the PGEN sub-chunk in bytes will be equal to four
		//		times the terminal preset�s wGenNdx plus four.
		if (numgens != sf2->PresetBags[sf2->NumPresetBags - 1].GenIndex + 1)
		{
			throw CBadForm();
		}
		sf2->PresetGenerators = gens = new SFGenList[numgens];
		sf2->NumPresetGenerators = numgens;
	}
	else
	{
		assert(chunkid == ID_igen);
		if (numgens != sf2->InstrBags[sf2->NumInstrBags - 1].GenIndex + 1)
		{
			throw CBadForm();
		}
		sf2->InstrGenerators = gens = new SFGenList[numgens];
		sf2->NumInstrGenerators = numgens;
	}
	
	for (i = numgens, gen = gens; i != 0; --i, ++gen)
	{
		gen->Oper = read_uword(f);
		gen->uAmount = read_uword(f);
#ifdef __BIG_ENDIAN__
		if (gen->Oper == GEN_keyRange || gen->Oper == GEN_velRange)
		{
			// Reswap range generators
			gen->uAmount = LittleShort(gen->uAmount);
		}
#endif
	}
}